

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

void Abc_GraphBuildFrontier
               (int nSize,Vec_Int_t *vEdges,Vec_Int_t *vLife,Vec_Wec_t *vFronts,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Vec_Wec_t *vNodes_00;
  Vec_Int_t *vVec;
  Vec_Int_t *p;
  int *pFront_00;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  double dVar8;
  Vec_Int_t *vState;
  int nStates;
  Vec_Int_t *vNode;
  Hsh_VecMan_t *pNext;
  Hsh_VecMan_t *pThis;
  int *pFront;
  int Next;
  int x;
  int s;
  int e;
  Vec_Int_t *vStateCount;
  Vec_Int_t *vStateNew;
  Vec_Wec_t *vNodes;
  int nNodes;
  int nEdges;
  double nPaths;
  abctime clk;
  int fVerbose_local;
  Vec_Wec_t *vFronts_local;
  Vec_Int_t *vLife_local;
  Vec_Int_t *vEdges_local;
  int nSize_local;
  
  aVar5 = Abc_Clock();
  iVar1 = Vec_IntSize(vEdges);
  iVar1 = iVar1 / 2;
  iVar2 = Vec_IntSize(vLife);
  vNodes_00 = Vec_WecAlloc(iVar1);
  vVec = Vec_IntAlloc(iVar2 / 2);
  p = Vec_IntAlloc(iVar1);
  pFront_00 = (int *)calloc((long)(iVar2 / 2),4);
  pNext = Hsh_VecManStart(1000);
  vNode = (Vec_Int_t *)Hsh_VecManStart(1000);
  Hsh_VecManAdd(pNext,vVec);
  for (x = 0; x < iVar1; x = x + 1) {
    p_00 = Vec_WecPushLevel(vNodes_00);
    iVar2 = Hsh_VecSize(pNext);
    Vec_IntPush(p,iVar2);
    if (fVerbose != 0) {
      printf("\n");
      uVar3 = Vec_IntEntry(vEdges,x << 1);
      uVar4 = Vec_IntEntry(vEdges,x * 2 + 1);
      printf("Processing edge %d = {%d %d}\n",(ulong)(uint)x,(ulong)uVar3,(ulong)uVar4);
      printf("Frontier: ");
      pVVar6 = Vec_WecEntry(vFronts,x);
      Vec_IntPrint(pVVar6);
      printf("\n");
    }
    for (Next = 0; Next < iVar2; Next = Next + 1) {
      pVVar6 = Hsh_VecReadEntry(pNext,Next);
      for (pFront._4_4_ = 0; pFront._4_4_ < 2; pFront._4_4_ = pFront._4_4_ + 1) {
        pFront._0_4_ = Abc_GraphBuildState(pVVar6,x,pFront._4_4_,vEdges,vLife,vFronts,pFront_00,vVec
                                           ,fVerbose);
        if ((uint)pFront == 1) {
          if (x == iVar1 + -1) {
            pFront._0_4_ = 0xfffffffe;
          }
          else {
            pFront._0_4_ = Hsh_VecManAdd((Hsh_VecMan_t *)vNode,vVec);
          }
        }
        if (fVerbose != 0) {
          printf("Return value = %d\n",(ulong)(uint)pFront);
        }
        Vec_IntPush(p_00,(uint)pFront);
      }
    }
    Hsh_VecManStop(pNext);
    pNext = (Hsh_VecMan_t *)vNode;
    vNode = (Vec_Int_t *)Hsh_VecManStart(1000);
  }
  dVar8 = Abc_GraphCountPaths(vNodes_00,vEdges);
  uVar3 = Vec_IntSum(p);
  printf("States = %8d   Paths = %24.0f  ",dVar8,(ulong)uVar3);
  aVar7 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar7 - aVar5);
  if (fVerbose != 0) {
    Vec_IntPrint(p);
  }
  Abc_GraphDeriveGiaDump(vNodes_00,vEdges,nSize);
  if (pFront_00 != (int *)0x0) {
    free(pFront_00);
  }
  Vec_WecFree(vNodes_00);
  Vec_IntFree(vVec);
  Vec_IntFree(p);
  Hsh_VecManStop(pNext);
  Hsh_VecManStop((Hsh_VecMan_t *)vNode);
  return;
}

Assistant:

void Abc_GraphBuildFrontier( int nSize, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int fVerbose )
{
    abctime clk = Abc_Clock();
    double nPaths;
    int nEdges = Vec_IntSize(vEdges)/2;
    int nNodes = Vec_IntSize(vLife)/2;
    Vec_Wec_t * vNodes = Vec_WecAlloc( nEdges );
    Vec_Int_t * vStateNew = Vec_IntAlloc( nNodes );
    Vec_Int_t * vStateCount = Vec_IntAlloc( nEdges );
    int e, s, x, Next, * pFront = ABC_CALLOC( int, nNodes );
    Hsh_VecMan_t * pThis = Hsh_VecManStart( 1000 );
    Hsh_VecMan_t * pNext = Hsh_VecManStart( 1000 );
    Hsh_VecManAdd( pThis, vStateNew );
    for ( e = 0; e < nEdges; e++ )
    {
        Vec_Int_t * vNode = Vec_WecPushLevel(vNodes);
        int nStates = Hsh_VecSize( pThis );
        Vec_IntPush( vStateCount, nStates );
        if ( fVerbose )
        {
            printf( "\n" );
            printf( "Processing edge %d = {%d %d}\n", e, Vec_IntEntry(vEdges, 2*e), Vec_IntEntry(vEdges, 2*e+1) );
            printf( "Frontier: " );  Vec_IntPrint( Vec_WecEntry(vFronts, e) );
            printf( "\n" );
        }
        for ( s = 0; s < nStates; s++ )
        {
            Vec_Int_t * vState = Hsh_VecReadEntry(pThis, s);
            for ( x = 0; x < 2; x++ )
            {
                Next = Abc_GraphBuildState(vState, e, x, vEdges, vLife, vFronts, pFront, vStateNew, fVerbose);
                if ( Next == 1 )
                {
                    if ( e == nEdges - 1 ) // last edge
                        Next = -2; // const1
                    else
                        Next = Hsh_VecManAdd( pNext, vStateNew );
                }
                if ( fVerbose ) printf( "Return value = %d\n", Next );
                Vec_IntPush( vNode, Next );
            }
        }
        Hsh_VecManStop( pThis );
        pThis = pNext;
        pNext = Hsh_VecManStart( 1000 );
    }
    nPaths = Abc_GraphCountPaths(vNodes, vEdges);
    printf( "States = %8d   Paths = %24.0f  ", Vec_IntSum(vStateCount), nPaths ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
        Vec_IntPrint( vStateCount );
    Abc_GraphDeriveGiaDump( vNodes, vEdges, nSize );
    ABC_FREE( pFront );
    Vec_WecFree( vNodes );
    Vec_IntFree( vStateNew );
    Vec_IntFree( vStateCount );
    Hsh_VecManStop( pThis );
    Hsh_VecManStop( pNext );
}